

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

void Am_Pop_Up_Generalize_DB(Am_Object *script_window,Am_Value_List *sel_list)

{
  bool bVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  Am_Object main_script_line_part;
  Am_Value value;
  Am_Object obj;
  ostrstream oss;
  char line [250];
  Am_Object AStack_2e8;
  Am_Value local_2e0;
  Am_Object local_2d0;
  Am_Object local_2c8;
  Am_Object local_2c0;
  Am_Object local_2b8;
  Am_Value_List local_2b0;
  Am_Value local_2a0 [22];
  char local_138 [264];
  
  Am_Value_List::Start(sel_list);
  pAVar5 = Am_Value_List::Get(sel_list);
  Am_Object::Am_Object(&AStack_2e8,pAVar5);
  pAVar5 = Am_Object::Get(&AStack_2e8,0xb8,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sel ",4);
    poVar6 = operator<<((ostream *)&std::cout,&AStack_2e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," slot ",6);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ostream::flush();
  }
  if ((uVar4 & 0xffff) == 0x16d) {
    popup_generalize_script_objects(&AStack_2e8,script_window,sel_list);
  }
  else {
    pAVar5 = Am_Object::Get(&AStack_2e8,0x169,0);
    Am_Value::Am_Value(&local_2e0,pAVar5);
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Value for value is ",0x13);
      poVar6 = operator<<((ostream *)&std::cout,&local_2e0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ostream::flush();
    }
    bVar1 = Am_Inter_Location::Test(&local_2e0);
    if (bVar1) {
      bVar2 = true;
      bVar1 = false;
    }
    else if (local_2e0.type == 0xa001) {
      Am_Object::Am_Object(&local_2b8,&local_2e0);
      Am_Object::Am_Object(&local_2c0,&Am_Inter_Location_Placeholder);
      bVar2 = Am_Object::Is_Instance_Of(&local_2b8,&local_2c0);
      bVar1 = true;
    }
    else {
      bVar1 = false;
      bVar2 = false;
    }
    if (bVar1) {
      Am_Object::~Am_Object(&local_2c0);
      Am_Object::~Am_Object(&local_2b8);
    }
    if (bVar2 == false) {
      bVar1 = Am_Value_List::Test(&local_2e0);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_2b0,&local_2e0);
        uVar3 = Am_Value_List::Length(&local_2b0);
        bVar1 = 1 < uVar3;
        Am_Value_List::~Am_Value_List(&local_2b0);
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        std::ostrstream::ostrstream((ostrstream *)local_2a0,local_138,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,
                   "Generalizing on List of Values not yet implemented.  Select one value in list.",
                   0x4e);
        std::ostream::put((char)local_2a0);
        Am_Pop_Up_Error_Window(local_138);
        std::ostrstream::~ostrstream((ostrstream *)local_2a0);
      }
      else if (local_2e0.type == 0xa001) {
        Am_Object::Am_Object(&local_2d0,&local_2e0);
        Am_Object::Am_Object(&local_2c8,&Am_A_Placeholder);
        bVar1 = Am_Object::Is_Instance_Of(&local_2d0,&local_2c8);
        Am_Object::~Am_Object(&local_2c8);
        if (bVar1) {
          pAVar5 = Am_Object::Get(&local_2d0,0x169,0);
          Am_Value::Am_Value(local_2a0,pAVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"for placeholder ",0x10);
          poVar6 = operator<<((ostream *)&std::cout,&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," found old val ",0xf);
          poVar6 = operator<<(poVar6,local_2a0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::ostream::flush();
          if (local_2a0[0].type == 0xa001) {
            popup_generalize_script_objects(&AStack_2e8,script_window,sel_list);
          }
          else {
            popup_generalize_script_value(&local_2e0,&AStack_2e8,script_window,sel_list);
          }
          Am_Value::~Am_Value(local_2a0);
        }
        else if ((uVar4 & 0xffff) == 0x169) {
          std::ostrstream::ostrstream((ostrstream *)local_2a0,local_138,0xfa,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"Can\'t generalize on Objects returned from commands.",
                     0x33);
          std::ostream::put((char)local_2a0);
          Am_Pop_Up_Error_Window(local_138);
          std::ostrstream::~ostrstream((ostrstream *)local_2a0);
        }
        else {
          popup_generalize_script_objects(&AStack_2e8,script_window,sel_list);
        }
        Am_Object::~Am_Object(&local_2d0);
      }
      else {
        popup_generalize_script_value(&local_2e0,&AStack_2e8,script_window,sel_list);
      }
    }
    else {
      popup_generalize_script_location(&AStack_2e8,script_window,sel_list);
    }
    Am_Value::~Am_Value(&local_2e0);
  }
  Am_Object::~Am_Object(&AStack_2e8);
  return;
}

Assistant:

void
Am_Pop_Up_Generalize_DB(Am_Object &script_window, Am_Value_List &sel_list)
{
  sel_list.Start();
  Am_Object main_script_line_part = sel_list.Get();
  Am_Slot_Key key =
      (Am_Slot_Key)(int)main_script_line_part.Get(Am_SLOTS_TO_SAVE);
  if (am_sdebug)
    std::cout << "sel " << main_script_line_part << " slot " << key << std::endl
              << std::flush;
  if (key == Am_OBJECT_MODIFIED) {
    popup_generalize_script_objects(main_script_line_part, script_window,
                                    sel_list);
  } else { //not object modified
    Am_Value value = main_script_line_part.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "Value for value is " << value << std::endl << std::flush;
    if (Am_Inter_Location::Test(value) ||
        (value.type == Am_OBJECT &&
         Am_Object(value).Is_Instance_Of(Am_Inter_Location_Placeholder))) {
      popup_generalize_script_location(main_script_line_part, script_window,
                                       sel_list);
    } else if (Am_Value_List::Test(value) &&
               Am_Value_List(value).Length() > 1) {
      AM_POP_UP_ERROR_WINDOW("Generalizing on List of Values not yet "
                             "implemented.  Select one value in list.");
    } else if (value.type == Am_OBJECT) {
      Am_Object obj = value;
      if (!obj.Is_Instance_Of(Am_A_Placeholder)) {
        // not a placeholder
        if (key == Am_VALUE) {
          AM_POP_UP_ERROR_WINDOW(
              "Can't generalize on Objects returned from commands.");
        } else
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
      } else { //is a placeholder
        Am_Value old_val = obj.Get(Am_VALUE);
        std::cout << "for placeholder " << obj << " found old val " << old_val
                  << std::endl
                  << std::flush;
        if (old_val.type == Am_OBJECT)
          popup_generalize_script_objects(main_script_line_part, script_window,
                                          sel_list);
        else
          popup_generalize_script_value(value, main_script_line_part,
                                        script_window, sel_list);
      }
    } else // not an object
      popup_generalize_script_value(value, main_script_line_part, script_window,
                                    sel_list);
  }
}